

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O2

void __thiscall mp::PLPoints::AddPoint(PLPoints *this,double x,double y)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  double local_18;
  double local_10;
  
  pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pdVar2 == pdVar3) || (pdVar3[-1] + 0.0001 < x)) {
    iVar4 = (int)((ulong)((long)pdVar3 - (long)pdVar2) >> 3);
    if ((iVar4 < 2) ||
       (((pdVar2 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start, pdVar2[iVar4 - 1] != y ||
         (dVar1 = pdVar2[iVar4 - 2], dVar1 != y)) || (NAN(dVar1) || NAN(y))))) {
      local_18 = y;
      local_10 = x;
      std::vector<double,_std::allocator<double>_>::push_back(&this->x_,&local_10);
      std::vector<double,_std::allocator<double>_>::push_back(&this->y_,&local_18);
    }
    else {
      pdVar3[-1] = x;
    }
  }
  return;
}

Assistant:

void AddPoint(double x, double y) {
    if (!empty())
      assert(x > x_.back());
    if (empty() || x>x_.back()+1e-4) {  // skip near points for Gurobi
      if (size()>=2 &&                  // simple check: 3rd equal y
         y_[size()-1]==y && y_[size()-2]==y) {
        x_.back() = x;                  // update last x
      } else {
        x_.push_back(x);
        y_.push_back(y);
      }
    }
  }